

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

void __thiscall CHud::RenderCheckpoint(CHud *this)

{
  int iVar1;
  int iVar2;
  IGraphics *pIVar3;
  ITextRender *pIVar4;
  int iVar5;
  int64 iVar6;
  int64 iVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined4 uVar9;
  float fVar10;
  char aBuf [64];
  char local_58 [64];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = time_get();
  if (this->m_CheckpointTime != 0) {
    lVar8 = iVar6 - this->m_CheckpointTime;
    iVar6 = time_freq();
    if (lVar8 < iVar6 * 4) {
      FormatTimeDiff(local_58,0x40,this->m_CheckpointDiff,2,true);
      iVar6 = time_freq();
      if (lVar8 == iVar6 * 2 || SBORROW8(lVar8,iVar6 * 2) != lVar8 + iVar6 * -2 < 0) {
        fVar10 = 1.0;
      }
      else {
        iVar6 = time_freq();
        iVar7 = time_freq();
        fVar10 = (float)(iVar6 * 4 - lVar8) / (float)(iVar7 * 2);
      }
      if (this->m_CheckpointDiff < 1) {
        if (this->m_CheckpointDiff < 0) {
          uVar9 = 0x3f000000;
        }
        else {
          uVar9 = 0x3f800000;
        }
        (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
          [4])(uVar9,0x3f800000,uVar9,fVar10);
      }
      else {
        (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
          [4])(0x3f800000,0x3f000000,0x3f000000);
      }
      pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      iVar1 = pIVar3->m_ScreenWidth;
      iVar2 = pIVar3->m_ScreenHeight;
      if (RenderCheckpoint()::s_Cursor == '\0') {
        iVar5 = __cxa_guard_acquire(&RenderCheckpoint()::s_Cursor);
        if (iVar5 != 0) {
          CTextCursor::CTextCursor(&RenderCheckpoint::s_Cursor,10.0,0);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderCheckpoint::s_Cursor,&__dso_handle);
          __cxa_guard_release(&RenderCheckpoint()::s_Cursor);
        }
      }
      RenderCheckpoint::s_Cursor.m_Align = 1;
      CTextCursor::Reset(&RenderCheckpoint::s_Cursor,-1);
      RenderCheckpoint::s_Cursor.m_CursorPos.field_1.y = 33.0;
      pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      RenderCheckpoint::s_Cursor.m_CursorPos.field_0.x = ((float)iVar1 / (float)iVar2) * 300.0 * 0.5
      ;
      (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
                (pIVar4,&RenderCheckpoint::s_Cursor,local_58,0xffffffff);
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderCheckpoint()
{
	int64 TimeSinceCheckpoint = time_get() - m_CheckpointTime;
	if(m_CheckpointTime != 0 && TimeSinceCheckpoint < time_freq() * 4)
	{
		char aBuf[64];
		FormatTimeDiff(aBuf, sizeof(aBuf), m_CheckpointDiff, 2);

		// calculate alpha (2 sec 1 than get lower the next 2 sec)
		float a = 1.0f;
		if(TimeSinceCheckpoint > time_freq() * 2)
		{
			// lower the alpha slowly to blend text out
			a = (time_freq() * 4 - TimeSinceCheckpoint) / (float)(time_freq() * 2);
		}

		if(m_CheckpointDiff > 0)
			TextRender()->TextColor(1.0f,0.5f,0.5f,a); // red
		else if(m_CheckpointDiff < 0)
			TextRender()->TextColor(0.5f,1.0f,0.5f,a); // green
		else if(!m_CheckpointDiff)
			TextRender()->TextColor(1,1,1,a); // white

		float Half = 300.0f*Graphics()->ScreenAspect()/2.0f;
		
		static CTextCursor s_Cursor(10);
		s_Cursor.m_Align = TEXTALIGN_TC;
		s_Cursor.Reset();
		s_Cursor.MoveTo(Half, 33);
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1);

		TextRender()->TextColor(1,1,1,1);
	}
}